

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaAttributeUsePtr_conflict
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,xmlNodePtr node)

{
  xmlSchemaAttributeUsePtr_conflict item;
  
  item = (xmlSchemaAttributeUsePtr_conflict)(*xmlMalloc)(0x48);
  if (item == (xmlSchemaAttributeUsePtr_conflict)0x0) {
    if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      pctxt->nberrors = pctxt->nberrors + 1;
    }
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating attribute");
  }
  else {
    *(undefined8 *)item = 0;
    item->annot = (xmlSchemaAnnotPtr)0x0;
    *(undefined8 *)&item->flags = 0;
    item->node = (xmlNodePtr)0x0;
    *(undefined8 *)&item->occurs = 0;
    item->defValue = (xmlChar *)0x0;
    item->next = (xmlSchemaAttributeUsePtr)0x0;
    item->attrDecl = (xmlSchemaAttributePtr)0x0;
    item->defVal = (xmlSchemaValPtr)0x0;
    item->type = XML_SCHEMA_TYPE_ATTRIBUTE_USE;
    item->node = node;
    xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,item);
  }
  return item;
}

Assistant:

static xmlSchemaAttributeUsePtr
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,
			 xmlNodePtr node)
{
    xmlSchemaAttributeUsePtr ret = NULL;

    if (pctxt == NULL)
        return (NULL);

    ret = (xmlSchemaAttributeUsePtr) xmlMalloc(sizeof(xmlSchemaAttributeUse));
    if (ret == NULL) {
        xmlSchemaPErrMemory(pctxt, "allocating attribute", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttributeUse));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTE_USE;
    ret->node = node;

    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}